

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.2.4.11.h
# Opt level: O1

void __thiscall
doctest::detail::
ContextScope<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/tests/DocTest_Tests/reporters/ReporterFactoryTests.cpp:40:9)>
::stringify(ContextScope<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_approvals[P]ApprovalTests_tests_DocTest_Tests_reporters_ReporterFactoryTests_cpp:40:9)>
            *this,ostream *s)

{
  MessageBuilder local_50;
  
  MessageBuilder::MessageBuilder
            (&local_50,
             "/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/tests/DocTest_Tests/reporters/ReporterFactoryTests.cpp"
             ,0x28,is_warn);
  local_50.m_stream = s;
  MessageBuilder::operator_(&local_50,(this->lambda_).testName);
  MessageBuilder::~MessageBuilder(&local_50);
  return;
}

Assistant:

void stringify(std::ostream* s) const override { lambda_(s); }